

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::Expression::convertAssignment
          (Expression *this,ASTContext *context,Type *type,Expression *expr,
          SourceRange assignmentRange,Expression **lhsExpr,
          bitmask<slang::ast::AssignFlags> *assignFlags)

{
  SymbolKind SVar1;
  SourceRange sourceRange;
  SourceRange range;
  SourceRange operatorRange;
  SourceRange operatorRange_00;
  SourceRange sourceRange_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  bitwidth_t bVar6;
  bitwidth_t bVar7;
  Expression *pEVar8;
  InstanceSymbolBase *instance;
  RandomizeDetails *pRVar9;
  Type *pTVar10;
  Expression *args_3;
  ValueRangeExpression *pVVar11;
  Diagnostic *diag;
  Diagnostic *diag_00;
  DiagCode code;
  RandomizeDetails *pRVar12;
  SourceLocation context_00;
  anon_class_40_5_378a8a91 *expr_00;
  Compilation *compilation;
  SourceRange assignmentRange_00;
  Expression *result;
  Expression *conn;
  undefined4 in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff70;
  ConversionKind in_stack_ffffffffffffff78;
  undefined1 local_80 [8];
  SourceRange local_78;
  SourceLocation local_68;
  Compilation *local_60;
  anon_class_40_5_378a8a91 local_58;
  
  context_00 = assignmentRange.endLoc;
  local_78.endLoc = assignmentRange.startLoc;
  local_78.startLoc = (SourceLocation)expr;
  local_68 = context_00;
  bVar5 = bad((Expression *)type);
  if (bVar5) {
    return (Expression *)type;
  }
  compilation = (Compilation *)**(undefined8 **)this;
  if (*(long *)&context[1].lookupIndex == 0) {
    Type::resolveCanonical((Type *)context);
  }
  if (**(int **)&context[1].lookupIndex == 0x24) {
    pEVar8 = badExpr(compilation,(Expression *)type);
    return pEVar8;
  }
  pTVar10 = (Type *)(type->super_Symbol).name._M_len;
  local_80 = (undefined1  [8])type;
  bVar5 = Type::isEquivalent((Type *)context,pTVar10);
  if (bVar5) {
    auVar2._4_8_ = in_stack_ffffffffffffff70;
    auVar2._0_4_ = in_stack_ffffffffffffff6c;
    auVar2._12_4_ = 0;
    contextDetermined(this,(ASTContext *)local_80,(Expression **)0x0,(Expression *)pTVar10,
                      (Type *)local_78.startLoc,(SourceRange)(auVar2 << 0x20),local_78.endLoc._0_4_)
    ;
    if (*(long *)&context[1].lookupIndex == 0) {
      Type::resolveCanonical((Type *)context);
    }
    if (**(int **)&context[1].lookupIndex == 0x18) {
      sourceRange.startLoc = (SourceLocation)(type->super_Symbol).parentScope;
      sourceRange.endLoc = (SourceLocation)(type->super_Symbol).nextInScope;
      ASTContext::addDiag((ASTContext *)this,(DiagCode)0xac0007,sourceRange);
    }
    if (((ulong)this->constant & 2) != 0) {
      return (Expression *)(Type *)local_80;
    }
    bVar5 = Type::isMatching((Type *)context,pTVar10);
    if (bVar5) {
      return (Expression *)(Type *)local_80;
    }
    operatorRange.endLoc = local_78.endLoc;
    operatorRange.startLoc = local_78.startLoc;
    ConversionExpression::checkImplicitConversions
              ((ConversionExpression *)this,(ASTContext *)pTVar10,(Type *)context,(Type *)local_80,
               (Expression *)0x0,(Expression *)0x0,operatorRange,in_stack_ffffffffffffff78);
    return (Expression *)(Type *)local_80;
  }
  instance = ASTContext::getInstance((ASTContext *)this);
  if ((instance == (InstanceSymbolBase *)0x0) ||
     ((instance->arrayPath)._M_extent._M_extent_value == 0)) goto LAB_0075c9c4;
  bVar6 = Type::getBitWidth((Type *)context);
  local_60 = compilation;
  bVar7 = Type::getBitWidth(pTVar10);
  compilation = local_60;
  if ((bVar6 == bVar7) && (bVar5 = Type::isAssignmentCompatible((Type *)context,pTVar10), bVar5))
  goto LAB_0075c9c4;
  if (local_68 == (SourceLocation)0x0) {
    pRVar9 = (RandomizeDetails *)
             tryConnectPortArray((ASTContext *)this,(Type *)context,(Expression *)type,instance);
    pRVar12 = pRVar9;
    local_58.context = (ASTContext *)pRVar9;
    if (pRVar9 != (RandomizeDetails *)0x0) {
      expr_00 = &local_58;
      goto LAB_0075c9a5;
    }
  }
  else {
    pRVar9 = (RandomizeDetails *)
             tryConnectPortArray((ASTContext *)this,pTVar10,*(Expression **)local_68,instance);
    pRVar12 = pRVar9;
    local_58.context = (ASTContext *)pRVar9;
    if (pRVar9 != (RandomizeDetails *)0x0) {
      selfDetermined((ASTContext *)this,(Expression **)&local_58);
      *(ASTContext **)local_68 = local_58.context;
      if (lhsExpr != (Expression **)0x0) {
        *(byte *)lhsExpr = *(byte *)lhsExpr | 0x80;
      }
      expr_00 = (anon_class_40_5_378a8a91 *)local_80;
LAB_0075c9a5:
      selfDetermined((ASTContext *)this,(Expression **)expr_00);
      pRVar9 = (RandomizeDetails *)expr_00->context;
      compilation = local_60;
    }
  }
  if (pRVar12 != (RandomizeDetails *)0x0) {
    return (Expression *)pRVar9;
  }
LAB_0075c9c4:
  bVar5 = Type::isAssignmentCompatible((Type *)context,pTVar10);
  if (bVar5) {
    bVar5 = Type::isNumeric((Type *)context);
    if ((bVar5) && (bVar5 = Type::isNumeric(pTVar10), bVar5)) {
      pTVar10 = OpInfo::binaryType(compilation,(Type *)context,pTVar10,false,true);
      bVar5 = Type::isEquivalent((Type *)context,pTVar10);
      if (bVar5) {
        auVar3._4_8_ = in_stack_ffffffffffffff70;
        auVar3._0_4_ = in_stack_ffffffffffffff6c;
        auVar3._12_4_ = 0;
        contextDetermined(this,(ASTContext *)local_80,(Expression **)0x0,(Expression *)context,
                          (Type *)local_78.startLoc,(SourceRange)(auVar3 << 0x20),
                          local_78.endLoc._0_4_);
        return (Expression *)(Type *)local_80;
      }
      auVar4._4_8_ = in_stack_ffffffffffffff70;
      auVar4._0_4_ = in_stack_ffffffffffffff6c;
      auVar4._12_4_ = 0;
      contextDetermined(this,(ASTContext *)local_80,(Expression **)0x0,(Expression *)pTVar10,
                        (Type *)local_78.startLoc,(SourceRange)(auVar4 << 0x20),
                        local_78.endLoc._0_4_);
    }
  }
  else {
    bVar5 = isImplicitlyAssignableTo((Expression *)type,compilation,(Type *)context);
    if (!bVar5) {
      SVar1 = (type->super_Symbol).kind;
      if (SVar1 == UntypedType) {
        local_58.assignmentRange = &local_78;
        local_58.lhsExpr = (Expression ***)&local_68;
        local_58.assignFlags = (bitmask<slang::ast::AssignFlags> **)&lhsExpr;
        pTVar10 = (Type *)(type->super_Symbol).name._M_len;
        local_58.context = (ASTContext *)this;
        local_58.type = (Type *)context;
        pEVar8 = convertAssignment::anon_class_40_5_378a8a91::operator()
                           (&local_58,(Expression *)(type->super_Symbol).originatingSyntax);
        args_3 = convertAssignment::anon_class_40_5_378a8a91::operator()
                           (&local_58,(Expression *)type->canonical);
        pVVar11 = BumpAllocator::
                  emplace<slang::ast::ValueRangeExpression,slang::ast::Type_const&,slang::ast::ValueRangeKind&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                            (&compilation->super_BumpAllocator,pTVar10,
                             &(type->super_Symbol).indexInScope,pEVar8,args_3,
                             (SourceRange *)&(type->super_Symbol).parentScope);
        (pVVar11->super_Expression).syntax = (ExpressionSyntax *)(type->super_Symbol).location;
        return &pVVar11->super_Expression;
      }
      if (SVar1 == QueueType) {
        assignmentRange_00.endLoc = (SourceLocation)this;
        assignmentRange_00.startLoc = local_78.endLoc;
        bVar5 = Bitstream::canBeSource
                          ((Bitstream *)context,type,
                           (StreamingConcatenationExpression *)local_78.startLoc,assignmentRange_00,
                           (ASTContext *)context_00);
        if (bVar5) {
          local_58.context = (ASTContext *)CONCAT44(local_58.context._4_4_,2);
          local_80 = (undefined1  [8])
                     BumpAllocator::
                     emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind,slang::ast::Expression&,slang::SourceRange&>
                               (&compilation->super_BumpAllocator,(Type *)context,
                                (ConversionKind *)&local_58,(Expression *)local_80,
                                (SourceRange *)((long)local_80 + 0x20));
          selfDetermined((ASTContext *)this,(Expression **)local_80);
          return &((ConversionExpression *)local_80)->super_Expression;
        }
      }
      else {
        code.subsystem = Expressions;
        code.code = 0x1d;
        if ((((ulong)this->constant & 0x10000000) == 0) &&
           ((bVar5 = Type::isCastCompatible((Type *)context,pTVar10), bVar5 ||
            (bVar5 = Type::isBitstreamCastable((Type *)context,pTVar10), bVar5)))) {
          code.subsystem = Expressions;
          code.code = 0x7f;
        }
        sourceRange_00.endLoc = local_78.endLoc;
        sourceRange_00.startLoc = local_78.startLoc;
        diag = ASTContext::addDiag((ASTContext *)this,code,sourceRange_00);
        diag_00 = ast::operator<<(diag,pTVar10);
        ast::operator<<(diag_00,(Type *)context);
        if (local_68 != (SourceLocation)0x0) {
          Diagnostic::operator<<(diag,*(SourceRange *)(*(long *)local_68 + 0x20));
        }
        range.startLoc = (SourceLocation)(type->super_Symbol).parentScope;
        range.endLoc = (SourceLocation)(type->super_Symbol).nextInScope;
        Diagnostic::operator<<(diag,range);
      }
      pEVar8 = badExpr(compilation,(Expression *)type);
      return pEVar8;
    }
  }
  operatorRange_00.endLoc = local_78.endLoc;
  operatorRange_00.startLoc = local_78.startLoc;
  pEVar8 = ConversionExpression::makeImplicit
                     ((ASTContext *)this,(Type *)context,Implicit,(Expression *)local_80,
                      (Expression *)0x0,operatorRange_00);
  return pEVar8;
}

Assistant:

Expression& Expression::convertAssignment(const ASTContext& context, const Type& type,
                                          Expression& expr, SourceRange assignmentRange,
                                          Expression** lhsExpr, bitmask<AssignFlags>* assignFlags) {
    if (expr.bad())
        return expr;

    Compilation& comp = context.getCompilation();
    if (type.isError())
        return badExpr(comp, &expr);

    Expression* result = &expr;
    const Type* rt = expr.type;

    auto finalizeType = [&](const Type& t) {
        contextDetermined(context, result, nullptr, t, assignmentRange, ConversionKind::Implicit);
    };

    if (type.isEquivalent(*rt)) {
        finalizeType(*rt);

        if (type.isVoid())
            context.addDiag(diag::VoidAssignment, expr.sourceRange);

        // If the types are not actually matching we might still want
        // to issue conversion warnings.
        if (!context.inUnevaluatedBranch() && !type.isMatching(*rt)) {
            ConversionExpression::checkImplicitConversions(context, *rt, type, *result, nullptr,
                                                           assignmentRange,
                                                           ConversionKind::Implicit);
        }

        return *result;
    }

    // If this is a port connection to an array of instances, check if the provided
    // expression represents an array that should be sliced on a per-instance basis.
    auto instance = context.getInstance();
    if (instance && !instance->arrayPath.empty()) {
        // If the connection is already of the right size and simply differs in
        // terms of four-statedness or signedness, don't bother trying to slice
        // out the connection.
        if (type.getBitWidth() != rt->getBitWidth() || !type.isAssignmentCompatible(*rt)) {
            // If we have an lhsExpr here, this is an output (or inout) port being connected.
            // We need to pass the lhs in as the expression to be connected, since we can't
            // slice the port side. If lhsExpr is null, this is an input port and we should
            // slice the incoming expression as an rvalue.
            if (lhsExpr) {
                Expression* conn = tryConnectPortArray(context, *rt, **lhsExpr, *instance);
                if (conn) {
                    selfDetermined(context, conn);
                    *lhsExpr = conn;

                    SLANG_ASSERT(assignFlags);
                    if (assignFlags)
                        *assignFlags |= AssignFlags::SlicedPort;

                    selfDetermined(context, result);
                    return *result;
                }
            }
            else {
                Expression* conn = tryConnectPortArray(context, type, expr, *instance);
                if (conn) {
                    selfDetermined(context, conn);
                    return *conn;
                }
            }
        }
    }

    if (!type.isAssignmentCompatible(*rt)) {
        if (expr.isImplicitlyAssignableTo(comp, type)) {
            return ConversionExpression::makeImplicit(context, type, ConversionKind::Implicit,
                                                      *result, nullptr, assignmentRange);
        }

        if (expr.kind == ExpressionKind::Streaming) {
            if (Bitstream::canBeSource(type, expr.as<StreamingConcatenationExpression>(),
                                       assignmentRange, context)) {
                // Add an implicit bit-stream casting otherwise types are not assignment compatible.
                // The size rule is not identical to explicit bit-stream casting so a different
                // ConversionKind is used.
                result = comp.emplace<ConversionExpression>(type, ConversionKind::StreamingConcat,
                                                            *result, result->sourceRange);
                selfDetermined(context, result);
                return *result;
            }
            return badExpr(comp, &expr);
        }

        if (expr.kind == ExpressionKind::ValueRange) {
            // Convert each side of the range and return that as a new range.
            auto convert = [&](Expression& expr) -> Expression& {
                if (expr.kind == ExpressionKind::UnboundedLiteral)
                    return expr;
                return convertAssignment(context, type, expr, assignmentRange, lhsExpr,
                                         assignFlags);
            };

            auto& vre = expr.as<ValueRangeExpression>();
            result = comp.emplace<ValueRangeExpression>(*expr.type, vre.rangeKind,
                                                        convert(vre.left()), convert(vre.right()),
                                                        expr.sourceRange);
            result->syntax = expr.syntax;
            return *result;
        }

        DiagCode code = diag::BadAssignment;
        if (!context.flags.has(ASTFlags::OutputArg) &&
            (type.isCastCompatible(*rt) || type.isBitstreamCastable(*rt))) {
            code = diag::NoImplicitConversion;
        }

        auto& diag = context.addDiag(code, assignmentRange);
        diag << *rt << type;
        if (lhsExpr)
            diag << (*lhsExpr)->sourceRange;

        diag << expr.sourceRange;
        return badExpr(comp, &expr);
    }

    if (type.isNumeric() && rt->isNumeric()) {
        // The "signednessFromRt" flag is important here; only the width of the lhs is
        // propagated down to operands, not the sign flag. Once the expression is appropriately
        // sized, the makeImplicit call down below will convert the sign for us.
        rt = OpInfo::binaryType(comp, &type, rt, false, /* signednessFromRt */ true);

        // If the final type is the same type (or equivalent) of the lhs, we know we're
        // performing an expansion of the rhs. The propagation performed by contextDetermined
        // will ensure that the expression has the correct resulting type, so we don't need an
        // additional implicit conversion. What's not obvious here is that simple assignments like:
        //      logic [3:0] a;
        //      logic [8:0] b;
        //      initial b = a;
        // will still result in an appropriate conversion warning because the type propagation
        // visitor will see that we're in an assignment and insert an implicit conversion for us.
        if (type.isEquivalent(*rt)) {
            finalizeType(type);
            return *result;
        }

        // Otherwise use the common type and fall through to get an implicit conversion
        // created for us.
        finalizeType(*rt);
    }

    return ConversionExpression::makeImplicit(context, type, ConversionKind::Implicit, *result,
                                              nullptr, assignmentRange);
}